

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Cec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Cec_ParCec_t *p;
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined8 *puVar7;
  Gia_Man_t *pGVar8;
  FILE *pFVar9;
  char *pcVar10;
  char *local_e8;
  char *pTemp_2;
  char *FileName;
  char *pcStack_d0;
  int n;
  char *pTemp_1;
  char *pFileNames [2];
  Abc_Cex_t *t;
  Gia_Man_t *pTemp;
  int fDumpMiter;
  int fDualOutput;
  int fMiter;
  int nArgcNew;
  int c;
  char **pArgvNew;
  Gia_Man_t *pMiter;
  Gia_Man_t *pGias [2];
  FILE *pFile;
  Cec_ParCec_t *pPars;
  uint local_48;
  Cec_ParCec_t ParsCec;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p = (Cec_ParCec_t *)((long)&pPars + 4);
  ParsCec._28_8_ = argv;
  memset(&pMiter,0,0x10);
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  Cec_ManCecSetDefaultParams(p);
  Extra_UtilGetoptReset();
LAB_002ac07c:
  do {
    iVar5 = Extra_UtilGetopt(argc,(char **)ParsCec._28_8_,"CTnmdasvh");
    if (iVar5 == -1) {
      puVar7 = (undefined8 *)(ParsCec._28_8_ + (long)globalUtilOptind * 8);
      iVar5 = argc - globalUtilOptind;
      if (bVar2) {
        if ((pAbc->pGia != (Gia_Man_t *)0x0) && (argc == globalUtilOptind)) {
          if (bVar3) {
            uVar6 = Gia_ManPoNum(pAbc->pGia);
            if ((uVar6 & 1) != 0) {
              Abc_Print(-1,"The dual-output miter should have an even number of outputs.\n");
              return 1;
            }
            if (ParsCec.fRewriting == 0) {
              Abc_Print(1,"Assuming the current network is a double-output miter.\n");
            }
            iVar5 = Cec_ManVerify(pAbc->pGia,p);
            pAbc->Status = iVar5;
          }
          else {
            if (ParsCec.fRewriting == 0) {
              Abc_Print(1,"Assuming the current network is a single-output miter.\n");
            }
            pGVar8 = Gia_ManDemiterToDual(pAbc->pGia);
            iVar5 = Cec_ManVerify(pGVar8,p);
            pAbc->Status = iVar5;
            pAVar1 = pAbc->pGia->pCexComb;
            pAbc->pGia->pCexComb = pGVar8->pCexComb;
            pGVar8->pCexComb = pAVar1;
            Gia_ManStop(pGVar8);
          }
          Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
          return 0;
        }
        Abc_Print(-1,
                  "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n"
                 );
        return 1;
      }
      if (2 < iVar5) {
        Abc_Print(-1,"Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n");
        return 1;
      }
      if (iVar5 == 2) {
        pFileNames[0] = (char *)puVar7[1];
        for (FileName._4_4_ = 0; FileName._4_4_ < 2; FileName._4_4_ = FileName._4_4_ + 1) {
          for (pcStack_d0 = pFileNames[(long)FileName._4_4_ + -1]; *pcStack_d0 != '\0';
              pcStack_d0 = pcStack_d0 + 1) {
            if (*pcStack_d0 == '>') {
              *pcStack_d0 = '\\';
            }
          }
          pFVar9 = fopen(pFileNames[(long)FileName._4_4_ + -1],"r");
          if (pFVar9 == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open input file \"%s\". ",pFileNames[(long)FileName._4_4_ + -1]);
            pcVar10 = Extra_FileGetSimilarName
                                (pFileNames[(long)FileName._4_4_ + -1],".aig",(char *)0x0,
                                 (char *)0x0,(char *)0x0,(char *)0x0);
            pFileNames[(long)FileName._4_4_ + -1] = pcVar10;
            if (pcVar10 != (char *)0x0) {
              Abc_Print(1,"Did you mean \"%s\"?",pFileNames[(long)FileName._4_4_ + -1]);
            }
            Abc_Print(1,"\n");
            return 1;
          }
          fclose(pFVar9);
          pGVar8 = Gia_AigerRead(pFileNames[(long)FileName._4_4_ + -1],0,0,0);
          pGias[(long)FileName._4_4_ + -1] = pGVar8;
          if (pGias[(long)FileName._4_4_ + -1] == (Gia_Man_t *)0x0) {
            Abc_Print(-1,"Reading AIGER from file \"%s\" has failed.\n",
                      pFileNames[(long)FileName._4_4_ + -1]);
            return 0;
          }
        }
      }
      else {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9Cec(): There is no current AIG.\n");
          return 1;
        }
        pMiter = pAbc->pGia;
        if (iVar5 == 1) {
          pTemp_2 = (char *)*puVar7;
        }
        else {
          if (argc != globalUtilOptind) {
            __assert_fail("nArgcNew == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                          ,0x9091,"int Abc_CommandAbc9Cec(Abc_Frame_t *, int, char **)");
          }
          if (pAbc->pGia->pSpec == (char *)0x0) {
            Abc_Print(-1,"File name is not given on the command line.\n");
            return 1;
          }
          pTemp_2 = pAbc->pGia->pSpec;
        }
        for (local_e8 = pTemp_2; *local_e8 != '\0'; local_e8 = local_e8 + 1) {
          if (*local_e8 == '>') {
            *local_e8 = '\\';
          }
        }
        pFVar9 = fopen(pTemp_2,"r");
        if (pFVar9 == (FILE *)0x0) {
          Abc_Print(-1,"Cannot open input file \"%s\". ",pTemp_2);
          pcVar10 = Extra_FileGetSimilarName
                              (pTemp_2,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
          if (pcVar10 != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",pcVar10);
          }
          Abc_Print(1,"\n");
          return 1;
        }
        fclose(pFVar9);
        pGias[0] = Gia_AigerRead(pTemp_2,0,0,0);
        if (pGias[0] == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Reading AIGER has failed.\n");
          return 0;
        }
      }
      pGVar8 = Gia_ManMiter(pMiter,pGias[0],0,1,0,0,ParsCec.fSilent);
      if (pGVar8 != (Gia_Man_t *)0x0) {
        if (bVar4) {
          Abc_Print(0,"The verification miter is written into file \"%s\".\n","cec_miter.aig");
          Gia_AigerWrite(pGVar8,"cec_miter.aig",0,0,0);
        }
        iVar5 = Cec_ManVerify(pGVar8,p);
        pAbc->Status = iVar5;
        Abc_FrameReplaceCex(pAbc,&pMiter->pCexComb);
        Gia_ManStop(pGVar8);
      }
      if (pMiter != pAbc->pGia) {
        Gia_ManStop(pMiter);
      }
      Gia_ManStop(pGias[0]);
      return 0;
    }
    switch(iVar5) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002ac8ad;
      }
      pPars._4_4_ = atoi(*(char **)(ParsCec._28_8_ + (long)globalUtilOptind * 8));
      uVar6 = pPars._4_4_;
      break;
    default:
      goto LAB_002ac8ad;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002ac8ad;
      }
      local_48 = atoi(*(char **)(ParsCec._28_8_ + (long)globalUtilOptind * 8));
      uVar6 = local_48;
      break;
    case 0x61:
      bVar4 = (bool)(bVar4 ^ 1);
      goto LAB_002ac07c;
    case 100:
      bVar3 = (bool)(bVar3 ^ 1);
      goto LAB_002ac07c;
    case 0x68:
      goto LAB_002ac8ad;
    case 0x6d:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002ac07c;
    case 0x6e:
      ParsCec.fUseSmartCnf = ParsCec.fUseSmartCnf ^ 1;
      goto LAB_002ac07c;
    case 0x73:
      ParsCec.fRewriting = ParsCec.fRewriting ^ 1;
      goto LAB_002ac07c;
    case 0x76:
      ParsCec.fSilent = ParsCec.fSilent ^ 1;
      goto LAB_002ac07c;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar6 < 0) {
LAB_002ac8ad:
      Abc_Print(-2,"usage: &cec [-CT num] [-nmdasvh]\n");
      Abc_Print(-2,"\t         new combinational equivalence checker\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)local_48);
      pcVar10 = "no";
      if (ParsCec.fUseSmartCnf != 0) {
        pcVar10 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar10);
      pcVar10 = "two circuits";
      if (bVar2) {
        pcVar10 = "miter";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar10);
      pcVar10 = "no";
      if (bVar3) {
        pcVar10 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar10);
      pcVar10 = "no";
      if (bVar4) {
        pcVar10 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle writing dual-output miter [default = %s]\n",pcVar10);
      pcVar10 = "no";
      if (ParsCec.fRewriting != 0) {
        pcVar10 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle silent operation [default = %s]\n",pcVar10);
      pcVar10 = "no";
      if (ParsCec.fSilent != 0) {
        pcVar10 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar10);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Cec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    FILE * pFile;
    Gia_Man_t * pGias[2] = {NULL, NULL}, * pMiter;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fDumpMiter = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdasvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 'a':
            fDumpMiter ^= 1;
            break;
        case 's':
            pPars->fSilent ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( fMiter )
    {
        if ( pAbc->pGia == NULL || nArgcNew != 0 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): A miter cannot be given as an argument of command &cec and should be entered using &r.\n" );
            return 1;
        }
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter.\n" );
            pAbc->Status = Cec_ManVerify( pAbc->pGia, pPars );
        }
        else
        {
            Gia_Man_t * pTemp;
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter.\n" );
            pTemp = Gia_ManDemiterToDual( pAbc->pGia );
            pAbc->Status = Cec_ManVerify( pTemp, pPars );
            ABC_SWAP( Abc_Cex_t *, pAbc->pGia->pCexComb, pTemp->pCexComb );
            Gia_ManStop( pTemp );
        }
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        return 0;
    }
    if ( nArgcNew > 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cec(): Wrong number of command-line arguments.\n" );
        return 1;
    }
    if ( nArgcNew == 2 )
    {
        char * pFileNames[2] = { pArgvNew[0], pArgvNew[1] }, * pTemp;
        int n;
        for ( n = 0; n < 2; n++ )
        {
            // fix the wrong symbol
            for ( pTemp = pFileNames[n]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( pFileNames[n], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", pFileNames[n] );
                if ( (pFileNames[n] = Extra_FileGetSimilarName( pFileNames[n], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", pFileNames[n] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[n] = Gia_AigerRead( pFileNames[n], 0, 0, 0 );
            if ( pGias[n] == NULL )
            {
                Abc_Print( -1, "Reading AIGER from file \"%s\" has failed.\n", pFileNames[n] );
                return 0;
            }
        }
    }
    else
    {
        char * FileName, * pTemp;
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cec(): There is no current AIG.\n" );
            return 1;
        }
        pGias[0] = pAbc->pGia;
        if ( nArgcNew == 1 )
            FileName = pArgvNew[0];
        else
        {
            assert( nArgcNew == 0 );
            if ( pAbc->pGia->pSpec == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
            FileName = pAbc->pGia->pSpec;
        }
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGias[1] = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pGias[1] == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    // compute the miter
    pMiter = Gia_ManMiter( pGias[0], pGias[1], 0, 1, 0, 0, pPars->fVerbose );
    if ( pMiter )
    {
        if ( fDumpMiter )
        {
            Abc_Print( 0, "The verification miter is written into file \"%s\".\n", "cec_miter.aig" );
            Gia_AigerWrite( pMiter, "cec_miter.aig", 0, 0, 0 );
        }
        pAbc->Status = Cec_ManVerify( pMiter, pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pMiter );
    }
    if ( pGias[0] != pAbc->pGia )
        Gia_ManStop( pGias[0] );
    Gia_ManStop( pGias[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: &cec [-CT num] [-nmdasvh]\n" );
    Abc_Print( -2, "\t         new combinational equivalence checker\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-a     : toggle writing dual-output miter [default = %s]\n", fDumpMiter? "yes":"no");
    Abc_Print( -2, "\t-s     : toggle silent operation [default = %s]\n", pPars->fSilent ? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}